

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

bool __thiscall ArgsManager::IsArgSet(ArgsManager *this,string *strArg)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  UniValue *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffffb8;
  ArgsManager *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetSetting(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bVar2 = UniValue::isNull(in_stack_ffffffffffffff68);
  UniValue::~UniValue(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return !bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::IsArgSet(const std::string& strArg) const
{
    return !GetSetting(strArg).isNull();
}